

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O0

QItemSelection * __thiscall
QAbstractProxyModel::mapSelectionFromSource
          (QAbstractProxyModel *this,QItemSelection *sourceSelection)

{
  bool bVar1;
  QModelIndex *index;
  qsizetype qVar2;
  const_reference pQVar3;
  long *in_RSI;
  QItemSelectionRange *in_RDI;
  long in_FS_OFFSET;
  int i;
  QItemSelection *proxySelection;
  QModelIndex srcIdx;
  QModelIndexList sourceIndexes;
  rvalue_ref in_stack_ffffffffffffff58;
  QModelIndex *in_stack_ffffffffffffff60;
  QItemSelectionRange *this_00;
  int local_68;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  QList<QModelIndex> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QItemSelection::indexes((QItemSelection *)in_stack_ffffffffffffff58);
  (((QList<QItemSelectionRange> *)&in_RDI->tl)->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->br).d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::QItemSelection((QItemSelection *)0x852c60);
  local_68 = 0;
  while( true ) {
    index = (QModelIndex *)(long)local_68;
    qVar2 = QList<QModelIndex>::size(&local_20);
    if (qVar2 <= (long)index) break;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = QList<QModelIndex>::at
                       ((QList<QModelIndex> *)in_stack_ffffffffffffff60,
                        (qsizetype)in_stack_ffffffffffffff58);
    (**(code **)(*in_RSI + 0x198))(&local_38,in_RSI,pQVar3);
    bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff60);
    if (bVar1) {
      QItemSelectionRange::QItemSelectionRange(this_00,index);
      QList<QItemSelectionRange>::operator<<
                ((QList<QItemSelectionRange> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_ffffffffffffff60);
    }
    local_68 = local_68 + 1;
  }
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x852d7f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QItemSelection *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QItemSelection QAbstractProxyModel::mapSelectionFromSource(const QItemSelection &sourceSelection) const
{
    QModelIndexList sourceIndexes = sourceSelection.indexes();
    QItemSelection proxySelection;
    for (int i = 0; i < sourceIndexes.size(); ++i) {
        const QModelIndex srcIdx = mapFromSource(sourceIndexes.at(i));
        if (!srcIdx.isValid())
            continue;
        proxySelection << QItemSelectionRange(srcIdx);
    }
    return proxySelection;
}